

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

vector<Span<const_char>,_std::allocator<Span<const_char>_>_> * __thiscall
util::Split<Span<char_const>>
          (vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *__return_storage_ptr__,
          util *this,Span<const_char> *sp,string_view separators)

{
  size_type sVar1;
  char *pcVar2;
  long in_FS_OFFSET;
  char *start;
  char *it;
  char *local_50;
  char *local_48;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  long local_30;
  
  local_40._M_str = (char *)separators._M_len;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>)
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>)
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>)
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48 = *(char **)this;
  pcVar2 = local_48;
  local_50 = local_48;
  local_40._M_len = (size_t)sp;
  for (; local_48 != pcVar2 + *(long *)(this + 8); local_48 = local_48 + 1) {
    sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::find(&local_40,*local_48,0);
    if (sVar1 != 0xffffffffffffffff) {
      std::vector<Span<char_const>,std::allocator<Span<char_const>>>::
      emplace_back<char_const*&,char_const*&>
                ((vector<Span<char_const>,std::allocator<Span<char_const>>> *)__return_storage_ptr__
                 ,&local_50,&local_48);
      local_50 = local_48 + 1;
    }
    pcVar2 = *(char **)this;
  }
  std::vector<Span<char_const>,std::allocator<Span<char_const>>>::
  emplace_back<char_const*&,char_const*&>
            ((vector<Span<char_const>,std::allocator<Span<char_const>>> *)__return_storage_ptr__,
             &local_50,&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> Split(const Span<const char>& sp, std::string_view separators)
{
    std::vector<T> ret;
    auto it = sp.begin();
    auto start = it;
    while (it != sp.end()) {
        if (separators.find(*it) != std::string::npos) {
            ret.emplace_back(start, it);
            start = it + 1;
        }
        ++it;
    }
    ret.emplace_back(start, it);
    return ret;
}